

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDPValueIteration.cpp
# Opt level: O2

void __thiscall MDPValueIteration::Initialize(MDPValueIteration *this)

{
  PlanningUnitDecPOMDPDiscrete *this_00;
  size_t sVar1;
  uint uVar2;
  size_t S;
  size_t A;
  uint uVar3;
  Index t;
  ulong uVar4;
  ulong uVar5;
  allocator<char> local_81;
  QTable tempTable;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tempTable,"Initialize",(allocator<char> *)&local_50);
  TimedAlgorithm::StartTimer(&this->super_TimedAlgorithm,(string *)&tempTable);
  std::__cxx11::string::~string((string *)&tempTable);
  this_00 = (this->super_MDPSolver)._m_pu;
  sVar1 = (this_00->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon;
  S = PlanningUnitMADPDiscrete::GetNrStates(&this_00->super_PlanningUnitMADPDiscrete);
  A = (**(code **)((long)*(((this->super_MDPSolver)._m_pu)->super_PlanningUnitMADPDiscrete)._m_madp
                  + 0x68))();
  uVar5 = 1;
  if (sVar1 != 999999) {
    uVar5 = sVar1;
  }
  this->_m_finiteHorizon = sVar1 != 999999;
  QTable::QTable(&tempTable,S,A);
  for (uVar2 = 0; S != uVar2; uVar2 = uVar2 + 1) {
    for (uVar3 = 0; A != uVar3; uVar3 = uVar3 + 1) {
      tempTable.super_matrix_t.data_.data_[tempTable.super_matrix_t.size2_ * uVar2 + (ulong)uVar3] =
           0.0;
    }
  }
  for (uVar4 = 0; uVar4 < uVar5; uVar4 = (ulong)((int)uVar4 + 1)) {
    std::vector<QTable,_std::allocator<QTable>_>::push_back(&this->_m_QValues,&tempTable);
  }
  this->_m_initialized = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Initialize",&local_81);
  TimedAlgorithm::StopTimer(&this->super_TimedAlgorithm,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
            (&tempTable.super_matrix_t.data_);
  return;
}

Assistant:

void MDPValueIteration::Initialize()
{
    StartTimer("Initialize");

    size_t horizon = GetPU()->GetHorizon();
    size_t nrS = GetPU()->GetNrStates();
    size_t nrJA =  GetPU()->GetNrJointActions();

    size_t nrQfunctions;
    if(horizon==MAXHORIZON)
    {
        _m_finiteHorizon=false;
        nrQfunctions=1;
    }
    else
    {
        _m_finiteHorizon=true;
        nrQfunctions=horizon;
    }

    QTable tempTable(nrS,nrJA);
    for(unsigned int s=0;s!=nrS;++s)
        for(unsigned int ja=0;ja!=nrJA;++ja)
            tempTable(s,ja)=0;

    for(Index t=0; t < nrQfunctions; t++)
        _m_QValues.push_back(tempTable);

    _m_initialized = true;

    StopTimer("Initialize");
}